

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,__1,__1> __thiscall Matrix<double,_-1,_-1>::Identity(Matrix<double,__1,__1> *this)

{
  int iVar1;
  ostream *poVar2;
  int i;
  int row;
  int j;
  int iVar3;
  double num;
  Matrix<double,__1,__1> MVar4;
  
  iVar1 = this->rows;
  if (iVar1 == this->cols) {
    iVar3 = iVar1;
    for (row = 0; row < iVar3; row = row + 1) {
      for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
        if (row == iVar3) {
          num = 1.0;
          iVar1 = row;
        }
        else {
          num = 0.0;
          iVar1 = iVar3;
        }
        SetElement(this,row,iVar1,num);
        iVar1 = this->cols;
      }
      iVar3 = this->rows;
    }
    MVar4 = *this;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "identity matrix can only be initialized by square matrix");
    std::endl<char,std::char_traits<char>>(poVar2);
    MVar4 = Zero(this);
  }
  return MVar4;
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::Identity()
{
    // 这样的实现方法会导致过多占用内存
    // 故不使用静态成员的方法实现
    // 2020 09 10
    // Matrix<Type, _0, _1> Identity;

    // 2020 09 11 
    // 恢复使用静态方法  问题已解决

    if(this->row() != this->col())
    {
        cerr << "identity matrix can only be initialized by square matrix" << endl;
        return this->Zero();
    }
    for (int i = 0; i < this->row(); ++i)
        for(int j = 0; j < this->col(); ++j)
            if(i == j)
                this->SetElement(i, j, 1);
            else
                this->SetElement(i, j, 0);
    return (*this);
}